

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::init
          (BaseRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  int iVar2;
  RenderTarget RVar3;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  NotSupportedError *pNVar6;
  mapped_type *pmVar7;
  ShaderProgram *this_00;
  ProgramSources *pPVar8;
  MessageBuilder *pMVar9;
  TestError *this_01;
  int iVar10;
  undefined1 auVar11 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  undefined1 local_280 [8];
  int local_278;
  StringTemplate fragmentSource;
  StringTemplate vertexSource;
  GLint maxSampleCount;
  string local_210 [32];
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [176];
  pointer local_100;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar5->m_width;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
    maxSampleCount = 0;
    (**(code **)(lVar4 + 0x880))(0x8d41,this->m_fboInternalFormat,0x80a9,1,&maxSampleCount);
    iVar2 = this->m_numRequestedSamples;
    iVar10 = maxSampleCount;
    if ((iVar2 != -2) && (iVar10 = iVar2, maxSampleCount < iVar2)) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)local_280,&this->m_numRequestedSamples);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     "Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     "x msaa rbo");
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    iVar10 = -1;
    if ((this->m_renderTarget == RENDERTARGET_DEFAULT) &&
       ((iVar2 < this->m_renderSize || (pRVar5->m_height < this->m_renderSize)))) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&maxSampleCount,"Render target size must be at least ",
                 (allocator<char> *)&local_1f0);
      de::toString<int>(&vertexSource.m_template,&this->m_renderSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &maxSampleCount,&vertexSource.m_template);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     "x");
      de::toString<int>(&fragmentSource.m_template,&this->m_renderSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                     &fragmentSource.m_template);
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\n${INTERPOLATION}out highp vec4 v_color;\nuniform highp float u_pointSize;\nvoid main ()\n{\n\tgl_Position = a_position;\n\tgl_PointSize = u_pointSize;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)&params);
  tcu::StringTemplate::StringTemplate(&vertexSource,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,
             "#version 300 es\nlayout(location = 0) out highp vec4 fragColor;\n${INTERPOLATION}in highp vec4 v_color;\nvoid main ()\n{\n\tfragColor = v_color;\n}\n"
             ,(allocator<char> *)&params);
  tcu::StringTemplate::StringTemplate(&fragmentSource,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"INTERPOLATION",(allocator<char> *)local_280);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&params,(key_type *)local_1b0);
  std::__cxx11::string::assign((char *)pmVar7);
  std::__cxx11::string::~string((string *)local_1b0);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100 = (pointer)0x0;
  uStack_f8 = 0;
  uStack_f7 = 0;
  uStack_f0 = 0;
  uStack_ef = 0;
  tcu::StringTemplate::specialize(&local_1f0,&vertexSource,&params);
  glu::VertexSource::VertexSource((VertexSource *)local_280,&local_1f0);
  pPVar8 = glu::ProgramSources::operator<<((ProgramSources *)local_1b0,(ShaderSource *)local_280);
  tcu::StringTemplate::specialize(&local_1d0,&fragmentSource,&params);
  glu::FragmentSource::FragmentSource((FragmentSource *)&maxSampleCount,&local_1d0);
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)&maxSampleCount);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar8);
  this->m_shader = this_00;
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_1f0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
  if ((this->m_shader->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"could not create shader",(allocator<char> *)local_280);
    tcu::TestError::TestError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  tcu::StringTemplate::~StringTemplate(&fragmentSource);
  tcu::StringTemplate::~StringTemplate(&vertexSource);
  if (this->m_renderTarget != RENDERTARGET_DEFAULT) {
    (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo);
    RVar3 = this->m_renderTarget;
    if (RVar3 - RENDERTARGET_RBO_SINGLESAMPLE < 2) {
      (**(code **)(lVar4 + 0x6e8))(1,&this->m_rbo);
      (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rbo);
      if (this->m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE) {
        (**(code **)(lVar4 + 0x1240))
                  (0x8d41,iVar10,this->m_fboInternalFormat,this->m_renderSize,this->m_renderSize);
      }
      else if (this->m_renderTarget == RENDERTARGET_RBO_SINGLESAMPLE) {
        (**(code **)(lVar4 + 0x1238))(0x8d41,this->m_fboInternalFormat,this->m_renderSize);
      }
      local_278 = (**(code **)(lVar4 + 0x800))();
      if (local_278 != 0) {
        if (local_278 == 0x505) {
          pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,"could not create target texture, got out of memory",
                     (allocator<char> *)&params);
          tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
          __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        auVar11 = __cxa_allocate_exception(0x38);
        local_280 = (undefined1  [8])glu::getErrorName;
        de::toString<tcu::Format::Enum<int,2ul>>((string *)&params,(de *)local_280,auVar11._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,"got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params)
        ;
        tcu::TestError::TestError(auVar11._0_8_,(string *)local_1b0);
        __cxa_throw(auVar11._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rbo);
LAB_00f76767:
      RVar3 = this->m_renderTarget;
      if (RVar3 == RENDERTARGET_RBO_MULTISAMPLE) {
        (**(code **)(lVar4 + 0x6d0))(1,&this->m_blitDstFbo);
        (**(code **)(lVar4 + 0x78))(0x8d40,this->m_blitDstFbo);
        (**(code **)(lVar4 + 0x6e8))(1,&this->m_blitDstRbo);
        (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_blitDstRbo);
        (**(code **)(lVar4 + 0x1238))(0x8d41,0x8058,this->m_renderSize);
        local_278 = (**(code **)(lVar4 + 0x800))();
        if (local_278 != 0) {
          if (local_278 == 0x505) {
            pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b0,"could not create blit target, got out of memory",
                       (allocator<char> *)&params);
            tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
            __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          auVar11 = __cxa_allocate_exception(0x38);
          local_280 = (undefined1  [8])glu::getErrorName;
          de::toString<tcu::Format::Enum<int,2ul>>((string *)&params,(de *)local_280,auVar11._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b0,"got ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params);
          tcu::TestError::TestError(auVar11._0_8_,(string *)local_1b0);
          __cxa_throw(auVar11._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_blitDstRbo);
        (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo);
        RVar3 = this->m_renderTarget;
      }
    }
    else if (RVar3 == RENDERTARGET_TEXTURE_2D) {
      (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture);
      (**(code **)(lVar4 + 0xb8))(0xde1,this->m_texture);
      (**(code **)(lVar4 + 0x1380))
                (0xde1,1,this->m_fboInternalFormat,this->m_renderSize,this->m_renderSize);
      local_278 = (**(code **)(lVar4 + 0x800))();
      if (local_278 != 0) {
        if (local_278 == 0x505) {
          pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,"could not create target texture, got out of memory",
                     (allocator<char> *)&params);
          tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
          __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        auVar11 = __cxa_allocate_exception(0x38);
        local_280 = (undefined1  [8])glu::getErrorName;
        de::toString<tcu::Format::Enum<int,2ul>>((string *)&params,(de *)local_280,auVar11._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,"got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params)
        ;
        tcu::TestError::TestError(auVar11._0_8_,(string *)local_1b0);
        __cxa_throw(auVar11._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texture,0);
      goto LAB_00f76767;
    }
    if (RVar3 == RENDERTARGET_RBO_MULTISAMPLE) {
      this->m_numSamples = -1;
      (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rbo);
      (**(code **)(lVar4 + 0xa30))(0x8d41,0x8cab,&this->m_numSamples);
      err = (**(code **)(lVar4 + 0x800))();
      glu::checkError(err,"get RENDERBUFFER_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizationTests.cpp"
                      ,0x12d);
      goto LAB_00f7687f;
    }
    if (RVar3 != RENDERTARGET_DEFAULT) {
      this->m_numSamples = 0;
      goto LAB_00f7687f;
    }
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  this->m_numSamples = pRVar5->m_numSamples;
LAB_00f7687f:
  (**(code **)(lVar4 + 0x868))(0xd50,&this->m_subpixelBits);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Sample count = ");
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_numSamples);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"SUBPIXEL_BITS = ");
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_subpixelBits);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  iVar2 = std::__cxx11::ostringstream::~ostringstream(poVar1);
  return iVar2;
}

Assistant:

void BaseRenderingCase::init (void)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const int				width					= m_context.getRenderTarget().getWidth();
	const int				height					= m_context.getRenderTarget().getHeight();
	int						msaaTargetSamples		= -1;

	// Requirements

	if (m_renderTarget == RENDERTARGET_DEFAULT && (width < m_renderSize || height < m_renderSize))
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));

	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		glw::GLint maxSampleCount = 0;
		gl.getInternalformativ(GL_RENDERBUFFER, m_fboInternalFormat, GL_SAMPLES, 1, &maxSampleCount);

		if (m_numRequestedSamples == SAMPLE_COUNT_MAX)
			msaaTargetSamples = maxSampleCount;
		else if (maxSampleCount >= m_numRequestedSamples)
			msaaTargetSamples = m_numRequestedSamples;
		else
			throw tcu::NotSupportedError("Test requires " + de::toString(m_numRequestedSamples) + "x msaa rbo");
	}

	// Gen shader

	{
		tcu::StringTemplate					vertexSource	(s_shaderVertexTemplate);
		tcu::StringTemplate					fragmentSource	(s_shaderFragmentTemplate);
		std::map<std::string, std::string>	params;

		params["INTERPOLATION"] = (m_flatshade) ? ("flat ") : ("");

		m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource.specialize(params)) << glu::FragmentSource(fragmentSource.specialize(params)));
		if (!m_shader->isOk())
			throw tcu::TestError("could not create shader");
	}

	// Fbo
	if (m_renderTarget != RENDERTARGET_DEFAULT)
	{
		glw::GLenum error;

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

		switch (m_renderTarget)
		{
			case RENDERTARGET_TEXTURE_2D:
			{
				gl.genTextures(1, &m_texture);
				gl.bindTexture(GL_TEXTURE_2D, m_texture);
				gl.texStorage2D(GL_TEXTURE_2D, 1, m_fboInternalFormat, m_renderSize, m_renderSize);

				error = gl.getError();
				if (error == GL_OUT_OF_MEMORY)
					throw tcu::NotSupportedError("could not create target texture, got out of memory");
				else if (error != GL_NO_ERROR)
					throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

				gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
				break;
			}

			case RENDERTARGET_RBO_SINGLESAMPLE:
			case RENDERTARGET_RBO_MULTISAMPLE:
			{
				gl.genRenderbuffers(1, &m_rbo);
				gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);

				if (m_renderTarget == RENDERTARGET_RBO_SINGLESAMPLE)
					gl.renderbufferStorage(GL_RENDERBUFFER, m_fboInternalFormat, m_renderSize, m_renderSize);
				else if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
					gl.renderbufferStorageMultisample(GL_RENDERBUFFER, msaaTargetSamples, m_fboInternalFormat, m_renderSize, m_renderSize);
				else
					DE_ASSERT(false);

				error = gl.getError();
				if (error == GL_OUT_OF_MEMORY)
					throw tcu::NotSupportedError("could not create target texture, got out of memory");
				else if (error != GL_NO_ERROR)
					throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

				gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo);
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	// Resolve (blitFramebuffer) target fbo for MSAA targets
	if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		glw::GLenum error;

		gl.genFramebuffers(1, &m_blitDstFbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_blitDstFbo);

		gl.genRenderbuffers(1, &m_blitDstRbo);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_blitDstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, m_renderSize, m_renderSize);

		error = gl.getError();
		if (error == GL_OUT_OF_MEMORY)
			throw tcu::NotSupportedError("could not create blit target, got out of memory");
		else if (error != GL_NO_ERROR)
			throw tcu::TestError("got " + de::toString(glu::getErrorStr(error)));

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_blitDstRbo);

		// restore state
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	}

	// Query info

	if (m_renderTarget == RENDERTARGET_DEFAULT)
		m_numSamples = m_context.getRenderTarget().getNumSamples();
	else if (m_renderTarget == RENDERTARGET_RBO_MULTISAMPLE)
	{
		m_numSamples = -1;
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);
		gl.getRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, &m_numSamples);

		GLU_EXPECT_NO_ERROR(gl.getError(), "get RENDERBUFFER_SAMPLES");
	}
	else
		m_numSamples = 0;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);

	m_testCtx.getLog() << tcu::TestLog::Message << "Sample count = " << m_numSamples << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}